

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite_orm.h
# Opt level: O0

bool __thiscall
sqlite_orm::internal::storage_impl_base::table_exists
          (storage_impl_base *this,string *tableName,sqlite3 *db)

{
  byte bVar1;
  int __v;
  ostream *poVar2;
  undefined8 uVar3;
  _func_int_void_ptr_int_char_ptr_ptr_char_ptr_ptr *p_Var4;
  undefined8 uVar5;
  error_category *__cat;
  undefined8 in_RDX;
  string *in_RSI;
  int rc;
  __string_type query;
  stringstream ss;
  bool result;
  error_code local_1f0;
  _lambda_void__int_char___char____1_ local_1dd;
  int local_1dc;
  string local_1d8 [16];
  char *in_stack_fffffffffffffe38;
  system_error *in_stack_fffffffffffffe40;
  error_code in_stack_fffffffffffffe48;
  stringstream local_1a8 [16];
  ostream local_198;
  byte local_19;
  undefined8 local_18;
  string *local_10;
  
  local_19 = 0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::__cxx11::stringstream::stringstream(local_1a8);
  poVar2 = std::operator<<(&local_198,"SELECT COUNT(*) FROM sqlite_master WHERE type = \'");
  poVar2 = std::operator<<(poVar2,"table");
  poVar2 = std::operator<<(poVar2,"\' AND name = \'");
  poVar2 = std::operator<<(poVar2,local_10);
  std::operator<<(poVar2,"\'");
  std::__cxx11::stringstream::str();
  uVar5 = local_18;
  uVar3 = std::__cxx11::string::c_str();
  p_Var4 = table_exists(std::__cxx11::string_const&,sqlite3*)_const::
           {lambda(void*,int,char**,char**)#1}::operator_cast_to_function_pointer(&local_1dd);
  local_1dc = sqlite3_exec(uVar5,uVar3,p_Var4,&local_19,0);
  bVar1 = local_19;
  if (local_1dc != 0) {
    uVar5 = __cxa_allocate_exception(0x20);
    __v = sqlite3_errcode(local_18);
    __cat = &get_sqlite_error_category()->super_error_category;
    std::error_code::error_code(&local_1f0,__v,__cat);
    sqlite3_errmsg(local_18);
    std::system_error::system_error
              (in_stack_fffffffffffffe40,in_stack_fffffffffffffe48,in_stack_fffffffffffffe38);
    __cxa_throw(uVar5,&std::system_error::typeinfo,std::system_error::~system_error);
  }
  std::__cxx11::string::~string(local_1d8);
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return (bool)(bVar1 & 1);
}

Assistant:

bool table_exists(const std::string &tableName, sqlite3 *db) const {
        auto result = false;
        std::stringstream ss;
        ss << "SELECT COUNT(*) FROM sqlite_master WHERE type = '"
           << "table"
           << "' AND name = '" << tableName << "'";
        auto query = ss.str();
        auto rc = sqlite3_exec(
            db,
            query.c_str(),
            [](void *data, int argc, char **argv, char * * /*azColName*/) -> int {
              auto &res = *(bool *)data;
              if(argc) {
                  res = !!std::atoi(argv[0]);
              }
              return 0;
            },
            &result,
            nullptr);
        if(rc != SQLITE_OK) {
            throw std::system_error(std::error_code(sqlite3_errcode(db), get_sqlite_error_category()),
                                    sqlite3_errmsg(db));
        }
        return result;
    }